

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_trait.cpp
# Opt level: O0

void __thiscall
pfederc::Parser::parseTraitBody
          (Parser *this,bool *err,
          list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
          *functions)

{
  bool bVar1;
  ExprType EVar2;
  Token *pTVar3;
  pointer pFVar4;
  TemplateDecls *pTVar5;
  const_reference pvVar6;
  pointer pTVar7;
  pointer this_00;
  Position *this_01;
  Position *pos;
  BodyExpr *pBVar8;
  pointer pEVar9;
  pointer local_c8;
  bool local_b1;
  undefined1 local_a8 [24];
  undefined1 local_90 [24];
  undefined1 local_78 [24];
  Position local_60;
  undefined1 local_48 [24];
  unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_> local_30;
  unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_> funcExpr;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  *functions_local;
  bool *err_local;
  Parser *this_local;
  
  do {
    while( true ) {
      pTVar3 = Lexer::getCurrentToken(this->lexer);
      bVar1 = Token::operator!=(pTVar3,TOK_STMT);
      local_b1 = false;
      if (bVar1) {
        pTVar3 = Lexer::getCurrentToken(this->lexer);
        local_b1 = Token::operator!=(pTVar3,TOK_EOF);
      }
      if (local_b1 == false) {
        return;
      }
      pTVar3 = Lexer::getCurrentToken(this->lexer);
      bVar1 = Token::operator==(pTVar3,TOK_EOL);
      if (!bVar1) break;
      Lexer::next(this->lexer);
    }
    parseExpression((Parser *)&funcExpr,(Precedence)this);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&funcExpr);
    if (bVar1) {
      pEVar9 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                         ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                          &funcExpr);
      EVar2 = Expr::getType(pEVar9);
      if (EVar2 != EXPR_FUNC) goto LAB_0014a46e;
      pEVar9 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::release
                         ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                          &funcExpr);
      if (pEVar9 == (pointer)0x0) {
        local_c8 = (pointer)0x0;
      }
      else {
        local_c8 = (pointer)__dynamic_cast(pEVar9,&Expr::typeinfo,&FuncExpr::typeinfo,0);
      }
      std::unique_ptr<pfederc::FuncExpr,std::default_delete<pfederc::FuncExpr>>::
      unique_ptr<std::default_delete<pfederc::FuncExpr>,void>
                ((unique_ptr<pfederc::FuncExpr,std::default_delete<pfederc::FuncExpr>> *)&local_30,
                 local_c8);
      pFVar4 = std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>::
               operator->(&local_30);
      pTVar5 = FuncExpr::getTemplates(pFVar4);
      bVar1 = std::
              vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
              ::empty(pTVar5);
      if (!bVar1) {
        local_48._6_2_ = 2;
        local_48._0_4_ = 0x17;
        pFVar4 = std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>::
                 operator->(&local_30);
        pTVar5 = FuncExpr::getTemplates(pFVar4);
        pvVar6 = std::
                 vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                 ::front(pTVar5);
        pTVar7 = std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>
                 ::operator->(pvVar6);
        this_00 = std::unique_ptr<pfederc::TokenExpr,_std::default_delete<pfederc::TokenExpr>_>::
                  operator->(&pTVar7->id);
        this_01 = Expr::getPosition(&this_00->super_Expr);
        pFVar4 = std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>::
                 operator->(&local_30);
        pTVar5 = FuncExpr::getTemplates(pFVar4);
        pvVar6 = std::
                 vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                 ::back(pTVar5);
        pTVar7 = std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>
                 ::operator->(pvVar6);
        pEVar9 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                           (&pTVar7->expr);
        pos = Expr::getPosition(pEVar9);
        Position::operator+(&local_60,this_01,pos);
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position>
                  ((Level *)(local_48 + 8),(SyntaxErrorCode *)(local_48 + 6),(Position *)local_48);
        generateError((Parser *)(local_48 + 0x10),
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)this);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   (local_48 + 0x10));
        std::
        unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
        ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)(local_48 + 8));
      }
      pFVar4 = std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>::
               operator->(&local_30);
      pBVar8 = FuncExpr::getBody(pFVar4);
      if (pBVar8 != (BodyExpr *)0x0) {
        local_78._6_2_ = 2;
        local_78._0_4_ = 0x18;
        pFVar4 = std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>::
                 operator->(&local_30);
        pBVar8 = FuncExpr::getBody(pFVar4);
        Expr::getPosition(&pBVar8->super_Expr);
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                  ((Level *)(local_78 + 8),(SyntaxErrorCode *)(local_78 + 6),(Position *)local_78);
        generateError((Parser *)(local_78 + 0x10),
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)this);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   (local_78 + 0x10));
        std::
        unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
        ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)(local_78 + 8));
      }
      std::__cxx11::
      list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
      ::push_back(functions,&local_30);
      std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>::~unique_ptr
                (&local_30);
    }
    else {
LAB_0014a46e:
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&funcExpr);
      if (bVar1) {
        local_90._6_2_ = 2;
        local_90._0_4_ = 0x16;
        pEVar9 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                           ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                            &funcExpr);
        Expr::getPosition(pEVar9);
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                  ((Level *)(local_90 + 8),(SyntaxErrorCode *)(local_90 + 6),(Position *)local_90);
        generateError((Parser *)(local_90 + 0x10),
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)this);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   (local_90 + 0x10));
        std::
        unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
        ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)(local_90 + 8));
      }
    }
    bVar1 = expect(this,TOK_EOL);
    if (!bVar1) {
      local_a8._6_2_ = 2;
      local_a8._0_4_ = 0xf;
      pTVar3 = Lexer::getCurrentToken(this->lexer);
      Token::getPosition(pTVar3);
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)(local_a8 + 8),(SyntaxErrorCode *)(local_a8 + 6),(Position *)local_a8);
      generateError((Parser *)(local_a8 + 0x10),
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)this);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 (local_a8 + 0x10));
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)(local_a8 + 8));
      skipToStmtEol(this);
    }
    std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
              ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&funcExpr);
  } while( true );
}

Assistant:

void Parser::parseTraitBody(bool &err,
    std::list<std::unique_ptr<FuncExpr>> &functions) noexcept {
  while (*lexer.getCurrentToken() != TokenType::TOK_STMT
      && *lexer.getCurrentToken() != TokenType::TOK_EOF) {
    if (*lexer.getCurrentToken() == TokenType::TOK_EOL) {
      lexer.next();
      continue;
    }

    std::unique_ptr<Expr> expr(parseExpression());
    if (expr && expr->getType() == ExprType::EXPR_FUNC) {
      std::unique_ptr<FuncExpr> funcExpr(
            dynamic_cast<FuncExpr*>(expr.release()));

      if (!funcExpr->getTemplates().empty()) {
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
              SyntaxErrorCode::STX_ERR_TRAIT_SCOPE_FUNC_TEMPL,
              funcExpr->getTemplates().front()->id->getPosition()
              + funcExpr->getTemplates().back()->expr->getPosition()));
      }

      if (funcExpr->getBody()) {
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
              SyntaxErrorCode::STX_ERR_TRAIT_SCOPE_FUNC_BODY,
              funcExpr->getBody()->getPosition()));
      }

      functions.push_back(std::move(funcExpr));
    } else if (expr) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR, 
            SyntaxErrorCode::STX_ERR_TRAIT_SCOPE, expr->getPosition()));
      // soft error
    }

    if (!expect(TokenType::TOK_EOL)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
      // soft error
      skipToStmtEol();
    }
  }
}